

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O3

int mp_div(mp_int *a,mp_int *b,mp_int *c,mp_int *d)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  mp_digit *pmVar8;
  mp_digit *pmVar9;
  long lVar10;
  ulong uVar11;
  mp_digit mVar12;
  long lVar13;
  long lVar14;
  int b_00;
  long lVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  mp_int x;
  mp_int y;
  mp_int t;
  int local_f8;
  mp_int local_e8;
  ulong local_c8;
  mp_int local_c0;
  mp_int local_a8;
  long local_90;
  ulong local_88;
  mp_digit *local_80;
  mp_int local_78;
  ulong local_60;
  long local_58;
  ulong local_50;
  mp_int local_48;
  
  if (b->used == 0) {
    return -3;
  }
  iVar5 = mp_cmp_mag(a,b);
  if (iVar5 == -1) {
    if (d == (mp_int *)0x0) {
      iVar5 = 0;
    }
    else {
      iVar5 = mp_copy(a,d);
    }
    if (c == (mp_int *)0x0) {
      return iVar5;
    }
    c->sign = 0;
    c->used = 0;
    if ((long)c->alloc < 1) {
      return iVar5;
    }
    memset(c->dp,0,(long)c->alloc << 3);
    return iVar5;
  }
  iVar5 = mp_init_size(&local_78,a->used + 2);
  if (iVar5 != 0) {
    return iVar5;
  }
  local_50 = (ulong)(uint)a->used;
  uVar16 = a->used + 2;
  local_78.used = uVar16;
  pmVar8 = (mp_digit *)calloc(1,0x100);
  local_c0.dp = pmVar8;
  if (pmVar8 == (mp_digit *)0x0) {
    iVar5 = -2;
    goto LAB_00105261;
  }
  local_c0.used = 0;
  local_c0.alloc = 0x20;
  local_c0.sign = 0;
  pmVar9 = (mp_digit *)calloc(1,0x100);
  if (pmVar9 != (mp_digit *)0x0) {
    local_80 = pmVar9;
    iVar5 = mp_init_copy(&local_e8,a);
    if (iVar5 == 0) {
      iVar5 = mp_init_copy(&local_a8,b);
      if (iVar5 == 0) {
        iVar2 = a->sign;
        iVar1 = b->sign;
        iVar6 = 0;
        local_a8.sign = 0;
        local_e8._8_8_ = local_e8._8_8_ & 0xffffffff00000000;
        uVar18 = (ulong)local_a8.used;
        if (uVar18 == 0) {
LAB_00105084:
          iVar6 = 0x3b - iVar6;
          iVar5 = mp_mul_2d(&local_e8,iVar6,&local_e8);
          if ((iVar5 != 0) || (iVar5 = mp_mul_2d(&local_a8,iVar6,&local_a8), iVar5 != 0))
          goto LAB_001051e2;
          uVar18 = local_a8._0_8_ & 0xffffffff;
          local_f8 = local_a8.used + -1;
        }
        else {
          local_f8 = local_a8.used + -1;
          uVar11 = local_a8.dp[uVar18 - 1];
          lVar10 = 0x3f;
          if (uVar11 != 0) {
            for (; uVar11 >> lVar10 == 0; lVar10 = lVar10 + -1) {
            }
          }
          iVar6 = (local_f8 * 0x3c + 0x40) - ((uint)lVar10 ^ 0x3f);
          if (uVar11 == 0) {
            iVar6 = local_f8 * 0x3c;
          }
          iVar6 = iVar6 % 0x3c;
          if (iVar6 < 0x3b) goto LAB_00105084;
          iVar6 = 0;
        }
        iVar7 = local_e8.used;
        lVar10 = (long)local_e8.used;
        b_00 = local_e8.used - (int)uVar18;
        iVar5 = mp_lshd(&local_a8,b_00);
        pmVar8 = local_78.dp;
        if (iVar5 == 0) {
          local_88 = CONCAT44(local_88._4_4_,b_00);
          local_90 = (long)b_00;
          local_c8 = uVar18;
          do {
            iVar5 = mp_cmp(&local_e8,&local_a8);
            if (iVar5 == -1) {
              mp_rshd(&local_a8,(int)local_88);
              uVar17 = (uint)local_c8;
              if (iVar7 <= (int)uVar17) goto LAB_0010559e;
              local_90 = (long)local_f8;
              local_60 = (ulong)~uVar17;
              local_88 = local_c8 & 0xffffffff;
              local_58 = (long)(int)uVar17;
              uVar18 = local_c8;
              goto LAB_001052d9;
            }
            pmVar8[local_90] = pmVar8[local_90] + 1;
            iVar5 = mp_sub(&local_e8,&local_a8,&local_e8);
          } while (iVar5 == 0);
        }
        goto LAB_001051e2;
      }
      goto LAB_0010520b;
    }
    goto LAB_0010522e;
  }
  iVar5 = -2;
LAB_00105245:
  free(pmVar8);
  local_c0.dp = (mp_digit *)0x0;
  local_c0.used = 0;
  local_c0.alloc = 0;
  local_c0.sign = 0;
LAB_00105261:
  if (local_78.dp != (mp_digit *)0x0) {
    free(local_78.dp);
  }
  return iVar5;
LAB_001054bb:
  iVar5 = mp_mul_d(&local_a8,pmVar8[lVar15],&local_c0);
  if ((iVar5 == 0) &&
     ((iVar5 = mp_lshd(&local_c0,iVar7), iVar5 == 0 &&
      (iVar5 = mp_sub(&local_e8,&local_c0,&local_e8), iVar5 == 0)))) {
    uVar18 = local_c8;
    if (local_e8.sign == 1) {
      iVar5 = mp_copy(&local_a8,&local_c0);
      if (((iVar5 != 0) || (iVar5 = mp_lshd(&local_c0,iVar7), iVar5 != 0)) ||
         (iVar5 = mp_add(&local_e8,&local_c0,&local_e8), iVar5 != 0)) goto LAB_001051e2;
      pmVar8[lVar15] = pmVar8[lVar15] + 0xfffffffffffffff & 0xfffffffffffffff;
      uVar18 = local_c8;
    }
    while (lVar10 = lVar14, local_58 < lVar14) {
LAB_001052d9:
      lVar14 = lVar10 + -1;
      if (lVar14 <= local_e8.used) {
        uVar11 = local_e8.dp[lVar14];
        if (uVar11 == local_a8.dp[local_90]) {
          iVar7 = (int)local_60 + (int)lVar10;
          lVar15 = (long)iVar7;
          pmVar8[lVar15] = 0xfffffffffffffff;
          uVar11 = 0;
        }
        else {
          auVar19 = __udivti3(uVar11 << 0x3c | local_e8.dp[lVar10 + -2],uVar11 >> 4,
                              local_a8.dp[local_90],0);
          uVar11 = auVar19._0_8_;
          if (0xffffffffffffffe < uVar11) {
            uVar11 = 0xfffffffffffffff;
          }
          if (auVar19._8_8_ != 0) {
            uVar11 = 0xfffffffffffffff;
          }
          iVar7 = (int)local_60 + (int)lVar10;
          lVar15 = (long)iVar7;
          pmVar8[lVar15] = uVar11;
          uVar11 = uVar11 + 1 & 0xfffffffffffffff;
        }
        pmVar8[lVar15] = uVar11;
        do {
          pmVar8[lVar15] = uVar11 + 0xfffffffffffffff & 0xfffffffffffffff;
          local_c0.sign = 0;
          if (0 < (long)local_c0.alloc) {
            memset(local_c0.dp,0,(long)local_c0.alloc << 3);
          }
          if ((int)uVar18 < 2) {
            mVar12 = 0;
          }
          else {
            mVar12 = local_a8.dp[local_88 - 2];
          }
          *local_c0.dp = mVar12;
          local_c0.dp[1] = local_a8.dp[local_90];
          local_c0.used = 2;
          iVar5 = mp_mul_d(&local_c0,pmVar8[lVar15],&local_c0);
          if (iVar5 != 0) goto LAB_001051e2;
          if (lVar10 < 3) {
            *local_80 = 0;
            if (lVar10 == 2) goto LAB_00105474;
            mVar12 = 0;
          }
          else {
            *local_80 = local_e8.dp[lVar10 + -3];
LAB_00105474:
            mVar12 = local_e8.dp[lVar10 + -2];
          }
          local_80[1] = mVar12;
          local_80[2] = local_e8.dp[lVar14];
          if (local_c0.used < 4) {
            if (local_c0.used != 3) goto LAB_001054bb;
            lVar13 = 2;
            while (local_c0.dp[lVar13] <= local_80[lVar13]) {
              if ((local_c0.dp[lVar13] < local_80[lVar13]) ||
                 (iVar5 = (int)lVar13, lVar13 = lVar13 + -1, iVar5 == 0)) goto LAB_001054bb;
            }
          }
          uVar11 = pmVar8[lVar15];
          uVar18 = local_c8;
        } while( true );
      }
    }
LAB_0010559e:
    uVar18 = (ulong)uVar16;
    if (local_e8.used == 0) {
      iVar5 = 0;
    }
    else {
      iVar5 = a->sign;
    }
    local_e8.sign = iVar5;
    if (c != (mp_int *)0x0) {
      if ((int)local_50 < -1) {
        if (uVar16 == 0) {
LAB_0010560c:
          local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
        }
      }
      else {
        if (pmVar8[uVar18 - 1] == 0) {
          pmVar8 = pmVar8 + (uVar18 - 2);
          do {
            iVar5 = (int)uVar18;
            if (iVar5 < 2) {
              local_78.used = iVar5 + -1;
              goto LAB_0010560c;
            }
            uVar16 = iVar5 - 1;
            uVar18 = (ulong)uVar16;
            mVar12 = *pmVar8;
            pmVar8 = pmVar8 + -1;
          } while (mVar12 == 0);
        }
        local_78.used = uVar16;
      }
      local_48.dp = local_78.dp;
      local_48.used = local_78.used;
      local_48.alloc = local_78.alloc;
      local_48.sign = local_78.sign;
      local_48._12_4_ = local_78._12_4_;
      pmVar8 = c->dp;
      uVar3._0_4_ = c->used;
      uVar3._4_4_ = c->alloc;
      uVar18 = *(ulong *)&c->sign;
      c->used = local_78.used;
      c->alloc = local_78.alloc;
      c->sign = local_78.sign;
      *(undefined4 *)&c->field_0xc = local_78._12_4_;
      c->dp = local_78.dp;
      c->sign = (uint)(iVar2 != iVar1);
      local_78._0_8_ = uVar3;
      local_78._8_8_ = uVar18;
      local_78.dp = pmVar8;
    }
    iVar5 = 0;
    if (d != (mp_int *)0x0) {
      mp_div_2d(&local_e8,iVar6,&local_e8,(mp_int *)0x0);
      local_48.dp = local_e8.dp;
      local_48.used = local_e8.used;
      local_48.alloc = local_e8.alloc;
      local_48._8_8_ = local_e8._8_8_;
      pmVar8 = d->dp;
      uVar4._0_4_ = d->used;
      uVar4._4_4_ = d->alloc;
      uVar18 = *(ulong *)&d->sign;
      d->used = local_e8.used;
      d->alloc = local_e8.alloc;
      d->sign = local_e8.sign;
      *(undefined4 *)&d->field_0xc = local_e8._12_4_;
      d->dp = local_e8.dp;
      local_e8._0_8_ = uVar4;
      local_e8._8_8_ = uVar18;
      local_e8.dp = pmVar8;
    }
  }
LAB_001051e2:
  if (local_a8.dp != (mp_digit *)0x0) {
    free(local_a8.dp);
    local_a8.dp = (mp_digit *)0x0;
    local_a8.used = 0;
    local_a8.alloc = 0;
    local_a8.sign = 0;
  }
LAB_0010520b:
  if (local_e8.dp != (mp_digit *)0x0) {
    free(local_e8.dp);
    local_e8.dp = (mp_digit *)0x0;
    local_e8.used = 0;
    local_e8.alloc = 0;
    local_e8._8_8_ = local_e8._8_8_ & 0xffffffff00000000;
  }
LAB_0010522e:
  free(local_80);
  pmVar8 = local_c0.dp;
  if (local_c0.dp == (mp_digit *)0x0) goto LAB_00105261;
  goto LAB_00105245;
}

Assistant:

int mp_div (mp_int * a, mp_int * b, mp_int * c, mp_int * d)
{
  mp_int  q, x, y, t1, t2;
  int     res, n, t, i, norm, neg;

  /* is divisor zero ? */
  if (mp_iszero (b) == 1) {
    return MP_VAL;
  }

  /* if a < b then q=0, r = a */
  if (mp_cmp_mag (a, b) == MP_LT) {
    if (d != NULL) {
      res = mp_copy (a, d);
    } else {
      res = MP_OKAY;
    }
    if (c != NULL) {
      mp_zero (c);
    }
    return res;
  }

  if ((res = mp_init_size (&q, a->used + 2)) != MP_OKAY) {
    return res;
  }
  q.used = a->used + 2;

  if ((res = mp_init (&t1)) != MP_OKAY) {
    goto LBL_Q;
  }

  if ((res = mp_init (&t2)) != MP_OKAY) {
    goto LBL_T1;
  }

  if ((res = mp_init_copy (&x, a)) != MP_OKAY) {
    goto LBL_T2;
  }

  if ((res = mp_init_copy (&y, b)) != MP_OKAY) {
    goto LBL_X;
  }

  /* fix the sign */
  neg = (a->sign == b->sign) ? MP_ZPOS : MP_NEG;
  x.sign = y.sign = MP_ZPOS;

  /* normalize both x and y, ensure that y >= b/2, [b == 2**DIGIT_BIT] */
  norm = mp_count_bits(&y) % DIGIT_BIT;
  if (norm < (int)(DIGIT_BIT-1)) {
     norm = (DIGIT_BIT-1) - norm;
     if ((res = mp_mul_2d (&x, norm, &x)) != MP_OKAY) {
       goto LBL_Y;
     }
     if ((res = mp_mul_2d (&y, norm, &y)) != MP_OKAY) {
       goto LBL_Y;
     }
  } else {
     norm = 0;
  }

  /* note hac does 0 based, so if used==5 then its 0,1,2,3,4, e.g. use 4 */
  n = x.used - 1;
  t = y.used - 1;

  /* while (x >= y*b**n-t) do { q[n-t] += 1; x -= y*b**{n-t} } */
  if ((res = mp_lshd (&y, n - t)) != MP_OKAY) { /* y = y*b**{n-t} */
    goto LBL_Y;
  }

  while (mp_cmp (&x, &y) != MP_LT) {
    ++(q.dp[n - t]);
    if ((res = mp_sub (&x, &y, &x)) != MP_OKAY) {
      goto LBL_Y;
    }
  }

  /* reset y by shifting it back down */
  mp_rshd (&y, n - t);

  /* step 3. for i from n down to (t + 1) */
  for (i = n; i >= (t + 1); i--) {
    if (i > x.used) {
      continue;
    }

    /* step 3.1 if xi == yt then set q{i-t-1} to b-1, 
     * otherwise set q{i-t-1} to (xi*b + x{i-1})/yt */
    if (x.dp[i] == y.dp[t]) {
      q.dp[i - t - 1] = ((((mp_digit)1) << DIGIT_BIT) - 1);
    } else {
      mp_word tmp;
      tmp = ((mp_word) x.dp[i]) << ((mp_word) DIGIT_BIT);
      tmp |= ((mp_word) x.dp[i - 1]);
      tmp /= ((mp_word) y.dp[t]);
      if (tmp > (mp_word) MP_MASK)
        tmp = MP_MASK;
      q.dp[i - t - 1] = (mp_digit) (tmp & (mp_word) (MP_MASK));
    }

    /* while (q{i-t-1} * (yt * b + y{t-1})) > 
             xi * b**2 + xi-1 * b + xi-2 
     
       do q{i-t-1} -= 1; 
    */
    q.dp[i - t - 1] = (q.dp[i - t - 1] + 1) & MP_MASK;
    do {
      q.dp[i - t - 1] = (q.dp[i - t - 1] - 1) & MP_MASK;

      /* find left hand */
      mp_zero (&t1);
      t1.dp[0] = (t - 1 < 0) ? 0 : y.dp[t - 1];
      t1.dp[1] = y.dp[t];
      t1.used = 2;
      if ((res = mp_mul_d (&t1, q.dp[i - t - 1], &t1)) != MP_OKAY) {
        goto LBL_Y;
      }

      /* find right hand */
      t2.dp[0] = (i - 2 < 0) ? 0 : x.dp[i - 2];
      t2.dp[1] = (i - 1 < 0) ? 0 : x.dp[i - 1];
      t2.dp[2] = x.dp[i];
      t2.used = 3;
    } while (mp_cmp_mag(&t1, &t2) == MP_GT);

    /* step 3.3 x = x - q{i-t-1} * y * b**{i-t-1} */
    if ((res = mp_mul_d (&y, q.dp[i - t - 1], &t1)) != MP_OKAY) {
      goto LBL_Y;
    }

    if ((res = mp_lshd (&t1, i - t - 1)) != MP_OKAY) {
      goto LBL_Y;
    }

    if ((res = mp_sub (&x, &t1, &x)) != MP_OKAY) {
      goto LBL_Y;
    }

    /* if x < 0 then { x = x + y*b**{i-t-1}; q{i-t-1} -= 1; } */
    if (x.sign == MP_NEG) {
      if ((res = mp_copy (&y, &t1)) != MP_OKAY) {
        goto LBL_Y;
      }
      if ((res = mp_lshd (&t1, i - t - 1)) != MP_OKAY) {
        goto LBL_Y;
      }
      if ((res = mp_add (&x, &t1, &x)) != MP_OKAY) {
        goto LBL_Y;
      }

      q.dp[i - t - 1] = (q.dp[i - t - 1] - 1UL) & MP_MASK;
    }
  }

  /* now q is the quotient and x is the remainder 
   * [which we have to normalize] 
   */
  
  /* get sign before writing to c */
  x.sign = x.used == 0 ? MP_ZPOS : a->sign;

  if (c != NULL) {
    mp_clamp (&q);
    mp_exch (&q, c);
    c->sign = neg;
  }

  if (d != NULL) {
    mp_div_2d (&x, norm, &x, NULL);
    mp_exch (&x, d);
  }

  res = MP_OKAY;

LBL_Y:mp_clear (&y);
LBL_X:mp_clear (&x);
LBL_T2:mp_clear (&t2);
LBL_T1:mp_clear (&t1);
LBL_Q:mp_clear (&q);
  return res;
}